

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
vkb::PhysicalDeviceSelector::select_device_names_abi_cxx11_
          (Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  bool bVar1;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *pvVar2;
  size_type sVar3;
  reference __x;
  error_code eVar4;
  error_code error_code;
  PhysicalDevice *pd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  error_category *local_68;
  undefined1 local_38 [8];
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  PhysicalDeviceSelector *this_local;
  
  selected_devices._24_8_ = this;
  select_impl((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
              local_38,this);
  bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_38);
  if (bVar1) {
    pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::value
                       ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                         *)local_38);
    sVar3 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::size(pvVar2);
    if (sVar3 == 0) {
      std::error_code::error_code<vkb::PhysicalDeviceError,void>
                ((error_code *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,no_suitable_device);
      eVar4._4_4_ = 0;
      eVar4._M_value =
           (uint)names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      eVar4._M_cat = local_68;
      Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::Result(__return_storage_ptr__,eVar4,VK_SUCCESS);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
      pvVar2 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::
               value((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                      *)local_38);
      __end1 = std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::begin(pvVar2)
      ;
      pd = (PhysicalDevice *)
           std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::end(pvVar2);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<const_vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                                    *)&pd);
        if (!bVar1) break;
        __x = __gnu_cxx::
              __normal_iterator<const_vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
              ::operator*(&__end1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,&__x->name);
        __gnu_cxx::
        __normal_iterator<const_vkb::PhysicalDevice_*,_std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
        ::operator++(&__end1);
      }
      Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::Result(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
    }
  }
  else {
    eVar4 = Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::error
                      ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
                        *)local_38);
    error_code._M_cat = eVar4._M_cat;
    error_code._4_4_ = 0;
    error_code._M_value = eVar4._M_value;
    Result<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
  }
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>::~Result
            ((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
             local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<std::string>> PhysicalDeviceSelector::select_device_names() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<std::string>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<std::string>>{ PhysicalDeviceError::no_suitable_device };
    }
    std::vector<std::string> names;
    for (const auto& pd : selected_devices.value()) {
        names.push_back(pd.name);
    }
    return names;
}